

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashFunction.h
# Opt level: O2

void __thiscall bwtil::HashFunction::quickSort(HashFunction *this,ulint *arr,uint n)

{
  ulong uVar1;
  ulint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  do {
    if (n < 2) {
      return;
    }
    uVar6 = (ulong)n;
    uVar3 = rand();
    uVar1 = arr[(ulong)uVar3 % uVar6];
    for (uVar7 = 0; (uVar8 = uVar6, uVar6 != uVar7 && (uVar8 = uVar7, arr[uVar7] < uVar1));
        uVar7 = uVar7 + 1) {
    }
    uVar7 = uVar8 & 0xffffffff;
LAB_00115f08:
    if ((uint)uVar7 < n) {
      for (uVar5 = uVar7 & 0xffffffff; uVar7 = uVar6, uVar6 != uVar5; uVar5 = uVar5 + 1) {
        if (arr[uVar5] < uVar1) {
          uVar2 = arr[uVar8 & 0xffffffff];
          arr[uVar8 & 0xffffffff] = arr[uVar5];
          uVar8 = (ulong)((int)uVar8 + 1);
          arr[uVar5] = uVar2;
          uVar7 = uVar5;
          break;
        }
      }
      goto LAB_00115f08;
    }
    if ((int)uVar8 == 0) {
      uVar3 = 0;
      do {
        uVar4 = uVar3;
        uVar3 = uVar4 + 1;
      } while (arr[uVar4] != uVar1);
      uVar2 = *arr;
      *arr = uVar1;
      uVar8 = 1;
      arr[uVar4] = uVar2;
    }
    quickSort(this,arr,(uint)uVar8);
    arr = arr + (uVar8 & 0xffffffff);
    n = n - (uint)uVar8;
  } while( true );
}

Assistant:

void quickSort(ulint *arr, uint n) {

		if(n<2) return;

		ulint pivot = arr[rand()%(n)];
		ulint t;
		uint i=0,j=0;

		while(i<n && arr[i]<pivot)
			i++;

		j=i;

		//invariant: arr[0,...,i-1]<pivot; arr[i,...,j]>=pivot
		while (j<n) {

			while(j<n && (arr[j]>=pivot))
				j++;

			if(j<n){//swap arr[i] and arr[j]
				t = arr[i];
				arr[i] = arr[j];
				arr[j] = t;
				i++;
			}

		}

		if(i==0){//pivot is the minimum element: avoid loop

			j=0;
			while(arr[j]!=pivot)
				j++;

			t = arr[i];
			arr[i] = arr[j];
			arr[j] = t;

			i++;
		}

		quickSort(arr,i);
		quickSort(arr+i,n-i);

	}